

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

int run_test_timer_run_once(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_a0 [8];
  uv_timer_t timer_handle;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,local_a0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x116,"0 == uv_timer_init(uv_default_loop(), &timer_handle)");
    abort();
  }
  iVar1 = uv_timer_start(local_a0,timer_run_once_timer_cb,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x117,"0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 0, 0)");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x118,"0 == uv_run(uv_default_loop(), UV_RUN_ONCE)");
    abort();
  }
  if (timer_run_once_timer_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x119,"1 == timer_run_once_timer_cb_called");
    abort();
  }
  iVar1 = uv_timer_start(local_a0,timer_run_once_timer_cb,1,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x11b,"0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 1, 0)");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x11c,"0 == uv_run(uv_default_loop(), UV_RUN_ONCE)");
    abort();
  }
  if (timer_run_once_timer_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x11d,"2 == timer_run_once_timer_cb_called");
    abort();
  }
  uv_close(local_a0,0);
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x120,"0 == uv_run(uv_default_loop(), UV_RUN_ONCE)");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
            ,0x122,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(timer_run_once) {
  uv_timer_t timer_handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 0, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT(1 == timer_run_once_timer_cb_called);

  ASSERT(0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 1, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT(2 == timer_run_once_timer_cb_called);

  uv_close((uv_handle_t*) &timer_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));

  MAKE_VALGRIND_HAPPY();
  return 0;
}